

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::WriteCHeader(CWriter *this)

{
  SymbolSet *this_00;
  SymbolMap *set;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  vector<wabt::Import_const*,std::allocator<wabt::Import_const*>> *this_02;
  CWriter *pCVar1;
  long *plVar2;
  Export **ppEVar3;
  pointer ppIVar4;
  iterator __position;
  CWriter *pCVar5;
  Global *global;
  Memory *memory;
  undefined8 *puVar6;
  int *piVar7;
  Module *pMVar8;
  pointer ppTVar9;
  TypeEntry *pTVar10;
  pointer ppIVar11;
  Import *pIVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  size_t sVar16;
  undefined8 uVar17;
  _Rb_tree_node_base *p_Var18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  undefined8 *puVar20;
  Newline *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  Newline *u;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u_00;
  char *pcVar23;
  Newline *u_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_02;
  Newline *extraout_RDX_01;
  Newline *extraout_RDX_02;
  Newline *u_03;
  Newline *extraout_RDX_03;
  Newline *extraout_RDX_04;
  Newline *extraout_RDX_05;
  Newline *extraout_RDX_06;
  Newline *extraout_RDX_07;
  Newline *extraout_RDX_08;
  Newline *extraout_RDX_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u_04;
  Newline *extraout_RDX_10;
  Newline *extraout_RDX_11;
  Newline *extraout_RDX_12;
  Newline *extraout_RDX_13;
  Newline *extraout_RDX_14;
  Newline *extraout_RDX_15;
  Newline *extraout_RDX_16;
  Newline *extraout_RDX_17;
  Newline *extraout_RDX_18;
  Newline *extraout_RDX_19;
  Newline *extraout_RDX_20;
  Newline *extraout_RDX_21;
  Newline *extraout_RDX_22;
  Newline *extraout_RDX_23;
  Newline *extraout_RDX_24;
  Newline *extraout_RDX_25;
  Newline *extraout_RDX_26;
  Newline *extraout_RDX_27;
  Newline *extraout_RDX_28;
  Newline *extraout_RDX_29;
  Newline *extraout_RDX_30;
  Newline *extraout_RDX_31;
  Newline *extraout_RDX_32;
  Newline *pNVar24;
  Newline *u_05;
  int iVar25;
  long *plVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  pointer ppIVar28;
  char *pcVar29;
  pointer pcVar30;
  long *plVar31;
  long lVar32;
  _Alloc_hider in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
  _Var34;
  const_iterator __begin3;
  long lVar35;
  long lVar36;
  pointer ppIVar37;
  undefined8 *puVar38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar39;
  __normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
  __it;
  ulong uVar40;
  pointer ppTVar41;
  string_view export_name;
  string_view module_name;
  string_view module_name_00;
  string_view module_name_01;
  string_view module_name_02;
  string_view module_name_03;
  string_view module_name_04;
  string_view str;
  string_view str_00;
  string_view module_name_05;
  string_view module_name_06;
  string_view module_name_07;
  string_view module_name_08;
  string_view str_01;
  string_view str_02;
  string_view module_name_09;
  string_view module_name_10;
  string_view str_03;
  string_view str_04;
  string_view module_name_11;
  string_view wasm_name;
  string_view export_name_00;
  string_view wasm_name_00;
  string_view export_name_01;
  string_view wasm_name_01;
  string_view export_name_02;
  string_view export_name_03;
  string_view export_name_04;
  string_view export_name_05;
  string_view export_name_06;
  string_view export_name_07;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>,_bool>
  pVar42;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar43;
  undefined1 auVar44 [16];
  string_view proposed_name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string name;
  Import *import;
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>_>
  import_map;
  string guard;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_03;
  _Alloc_hider in_stack_fffffffffffffed0;
  SymbolSet *local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  undefined1 local_e8 [32];
  string local_c8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Rb_tree_node_base *local_88;
  size_t local_80;
  CWriter *local_78;
  CWriter *local_70;
  CWriter *local_68;
  long *local_60;
  size_t local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (this->module_->exports).
            super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (this->module_->exports).
             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pbVar22 != local_f0) {
    this_00 = &this->global_syms_;
    set = &this->global_sym_map_;
    do {
      pcVar30 = (pbVar22->_M_dataplus)._M_p;
      in_R8._M_p = *pcVar30;
      in_RCX = *(Newline **)(pcVar30 + 8);
      export_name._M_str = in_R8._M_p;
      export_name._M_len = (size_t)in_RCX;
      (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)this,export_name);
      wasm_name._M_str = (char *)&stack0xfffffffffffffed0;
      wasm_name._M_len = (size_t)in_R8._M_p;
      ClaimName((CWriter *)this_00,(SymbolSet *)set,(SymbolMap *)0x64,(char)in_RCX,wasm_name,
                (string *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0._M_p != &local_120) {
        operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
      }
      pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar22->_M_string_length;
    } while (pbVar22 != local_f0);
  }
  *(undefined8 *)((long)this + 0x18) = *(undefined8 *)((long)this + 0x38);
  local_50._M_allocated_capacity = (size_type)&local_40;
  local_50._8_8_ = 0;
  local_40._M_local_buf[0] = '\0';
  lVar36 = *(long *)((long)this + 0x50);
  if (lVar36 != 0) {
    lVar32 = *(long *)((long)this + 0x48);
    lVar35 = 0;
    do {
      iVar25 = (int)*(char *)(lVar32 + lVar35);
      uVar15 = isalnum(iVar25);
      if ((iVar25 == 0x5f) || (in_RCX = (Newline *)(ulong)uVar15, uVar15 != 0)) {
        toupper(iVar25);
      }
      std::__cxx11::string::push_back((char)&local_50);
      lVar35 = lVar35 + 1;
    } while (lVar36 != lVar35);
  }
  pcVar29 = "_GENERATED_";
  std::__cxx11::string::append(local_50._M_local_buf);
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)this;
  (anonymous_namespace)::CWriter::Write<char_const(&)[40],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [40])pcVar29,u);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [9])"#ifndef ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,in_RCX);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[9],std::__cxx11::string&,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [9])"#define ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,in_RCX);
  if (*(int *)((long)this + 0x94) < 2) {
    WriteData(this,"\n",1);
    this = (CWriter *)paVar21;
    *(int *)((long)this + 0x94) = *(int *)((long)this + 0x94) + 1;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)this;
  }
  *(CWriter *)((long)this + 0x90) = (CWriter)0x1;
  lVar36 = *(long *)((long)this + 8);
  if (*(char *)(lVar36 + 0x388) != '\x01') {
    bVar14 = false;
    goto LAB_0019c28f;
  }
  in_RCX = (Newline *)0xfffffffb;
  plVar26 = *(long **)(lVar36 + 0xa0);
  plVar2 = *(long **)(lVar36 + 0xa8);
  in_R8._M_p = (pointer)((long)plVar2 - (long)plVar26 >> 5);
  plVar31 = plVar26;
  if (0 < (long)in_R8._M_p) {
    plVar31 = (long *)(((long)plVar2 - (long)plVar26 & 0xffffffffffffffe0U) + (long)plVar26);
    in_R8._M_p = (pointer)((long)in_R8._M_p + 1);
    plVar26 = plVar26 + 2;
    do {
      if (*(int *)(plVar26[-2] + 0x20) == -5) {
        plVar26 = plVar26 + -2;
        goto LAB_0019c00e;
      }
      if (*(int *)(plVar26[-1] + 0x20) == -5) {
        plVar26 = plVar26 + -1;
        goto LAB_0019c00e;
      }
      if (*(int *)(*plVar26 + 0x20) == -5) goto LAB_0019c00e;
      if (*(int *)(plVar26[1] + 0x20) == -5) {
        plVar26 = plVar26 + 1;
        goto LAB_0019c00e;
      }
      in_R8._M_p = in_R8._M_p + -1;
      plVar26 = plVar26 + 4;
    } while (1 < (long)in_R8._M_p);
  }
  lVar32 = (long)plVar2 - (long)plVar31 >> 3;
  if (lVar32 == 1) {
LAB_0019bfe8:
    plVar26 = plVar31;
    if (*(int *)(*plVar31 + 0x20) != -5) {
      plVar26 = plVar2;
    }
  }
  else if (lVar32 == 2) {
LAB_0019bfdc:
    plVar26 = plVar31;
    if (*(int *)(*plVar31 + 0x20) != -5) {
      plVar31 = plVar31 + 1;
      goto LAB_0019bfe8;
    }
  }
  else {
    plVar26 = plVar2;
    if ((lVar32 == 3) && (plVar26 = plVar31, *(int *)(*plVar31 + 0x20) != -5)) {
      plVar31 = plVar31 + 1;
      goto LAB_0019bfdc;
    }
  }
LAB_0019c00e:
  bVar14 = true;
  if (plVar26 != plVar2) goto LAB_0019c28f;
  pbVar22 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar36 + 0xb8);
  local_f0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar36 + 0xc0);
  lVar32 = (long)local_f0 - (long)pbVar22 >> 5;
  pbVar33 = pbVar22;
  if (0 < lVar32) {
    pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(pbVar22->_M_dataplus)._M_p +
              ((long)local_f0 - (long)pbVar22 & 0xffffffffffffffe0U));
    lVar32 = lVar32 + 1;
    pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar22->field_2
    ;
    do {
      if ((*(int *)(pbVar22[-1].field_2._M_allocated_capacity + 0x48) == 0) &&
         (this = (CWriter *)paVar21,
         bVar13 = func_uses_simd((FuncSignature *)(pbVar22[-1].field_2._M_allocated_capacity + 0xc0)
                                ),
         paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)this, bVar13)) {
        pbVar39 = local_f0;
        pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar22[-1].field_2;
        goto LAB_0019c195;
      }
      lVar35 = *(long *)((long)&pbVar22[-1].field_2 + 8);
      if ((*(int *)(lVar35 + 0x48) == 0) &&
         (this = (CWriter *)paVar21, bVar13 = func_uses_simd((FuncSignature *)(lVar35 + 0xc0)),
         paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)this, bVar13)) {
        pbVar39 = local_f0;
        pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&pbVar22[-1].field_2 + 8);
        goto LAB_0019c195;
      }
      pcVar30 = (pbVar22->_M_dataplus)._M_p;
      if ((*(int *)(pcVar30 + 0x48) == 0) &&
         (this = (CWriter *)paVar21, bVar13 = func_uses_simd((FuncSignature *)(pcVar30 + 0xc0)),
         pbVar39 = local_f0,
         paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)this, bVar13)) goto LAB_0019c195;
      if ((*(int *)(pbVar22->_M_string_length + 0x48) == 0) &&
         (this = (CWriter *)paVar21,
         bVar13 = func_uses_simd((FuncSignature *)(pbVar22->_M_string_length + 0xc0)),
         paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)this, bVar13)) {
        pbVar39 = local_f0;
        pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar22->_M_string_length;
        goto LAB_0019c195;
      }
      lVar32 = lVar32 + -1;
      pbVar22 = pbVar22 + 1;
    } while (1 < lVar32);
  }
  pbVar39 = local_f0;
  lVar32 = (long)local_f0 - (long)pbVar33 >> 3;
  if (lVar32 == 1) {
LAB_0019c158:
    pcVar30 = (pbVar33->_M_dataplus)._M_p;
    pbVar22 = pbVar39;
    if ((*(int *)(pcVar30 + 0x48) == 0) &&
       (this = (CWriter *)paVar21, bVar13 = func_uses_simd((FuncSignature *)(pcVar30 + 0xc0)),
       pbVar22 = pbVar33,
       paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)this, !bVar13)) {
      pbVar22 = pbVar39;
    }
  }
  else if (lVar32 == 2) {
LAB_0019c136:
    pcVar30 = (pbVar33->_M_dataplus)._M_p;
    if ((*(int *)(pcVar30 + 0x48) != 0) ||
       (this = (CWriter *)paVar21, bVar13 = func_uses_simd((FuncSignature *)(pcVar30 + 0xc0)),
       pbVar22 = pbVar33,
       paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)this, !bVar13)) {
      pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar33->_M_string_length;
      goto LAB_0019c158;
    }
  }
  else {
    pbVar22 = pbVar39;
    if ((lVar32 == 3) &&
       ((pcVar30 = (pbVar33->_M_dataplus)._M_p, *(int *)(pcVar30 + 0x48) != 0 ||
        (this = (CWriter *)paVar21, bVar13 = func_uses_simd((FuncSignature *)(pcVar30 + 0xc0)),
        pbVar22 = pbVar33,
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)this, !bVar13)))) {
      pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar33->_M_string_length;
      goto LAB_0019c136;
    }
  }
LAB_0019c195:
  if (pbVar22 != pbVar39) goto LAB_0019c28f;
  __it._M_current = *(Export ***)(lVar36 + 0xd0);
  ppEVar3 = *(Export ***)(lVar36 + 0xd8);
  lVar36 = (long)ppEVar3 - (long)__it._M_current >> 5;
  in_stack_fffffffffffffed0._M_p = (pointer)this;
  if (0 < lVar36) {
    lVar36 = lVar36 + 1;
    do {
      this = (CWriter *)paVar21;
      bVar14 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)&stack0xfffffffffffffed0,__it);
      _Var34._M_current = __it._M_current;
      if (bVar14) goto LAB_0019c284;
      bVar14 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)&stack0xfffffffffffffed0,
                          (__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                           )(__it._M_current + 1));
      _Var34._M_current = __it._M_current + 1;
      if (bVar14) goto LAB_0019c284;
      bVar14 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)&stack0xfffffffffffffed0,
                          (__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                           )(__it._M_current + 2));
      _Var34._M_current = __it._M_current + 2;
      if (bVar14) goto LAB_0019c284;
      bVar14 = __gnu_cxx::__ops::
               _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                         ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                           *)&stack0xfffffffffffffed0,
                          (__normal_iterator<wabt::Export_*const_*,_std::vector<wabt::Export_*,_std::allocator<wabt::Export_*>_>_>
                           )(__it._M_current + 3));
      _Var34._M_current = __it._M_current + 3;
      if (bVar14) goto LAB_0019c284;
      __it._M_current = __it._M_current + 4;
      lVar36 = lVar36 + -1;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)this;
    } while (1 < lVar36);
  }
  this = (CWriter *)paVar21;
  lVar36 = (long)ppEVar3 - (long)__it._M_current >> 3;
  if (lVar36 == 1) {
LAB_0019c26e:
    bVar14 = __gnu_cxx::__ops::
             _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                       ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2> *
                        )&stack0xfffffffffffffed0,__it);
    _Var34._M_current = __it._M_current;
    if (!bVar14) {
      _Var34._M_current = ppEVar3;
    }
  }
  else if (lVar36 == 2) {
LAB_0019c259:
    bVar14 = __gnu_cxx::__ops::
             _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::operator()
                       ((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2> *
                        )&stack0xfffffffffffffed0,__it);
    _Var34._M_current = __it._M_current;
    if (!bVar14) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0019c26e;
    }
  }
  else {
    _Var34._M_current = ppEVar3;
    if ((lVar36 == 3) &&
       (bVar14 = __gnu_cxx::__ops::
                 _Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::$_2>::
                 operator()((_Iter_pred<wabt::(anonymous_namespace)::CWriter::ComputeSimdScope()::__2>
                             *)&stack0xfffffffffffffed0,__it), _Var34._M_current = __it._M_current,
       !bVar14)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0019c259;
    }
  }
LAB_0019c284:
  bVar14 = _Var34._M_current != ppEVar3;
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)this;
LAB_0019c28f:
  *(bool *)((long)this + 0x348) = bVar14;
  WriteData(this,"#include \"wasm-rt.h\"",0x14);
  pNVar24 = extraout_RDX;
  if (*(int *)(paVar21->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar21,"\n",1);
    *(int *)(paVar21->_M_local_buf + 0x94) = *(int *)(paVar21->_M_local_buf + 0x94) + 1;
    pNVar24 = extraout_RDX_00;
  }
  paVar21->_M_local_buf[0x90] = '\x01';
  if (*(char *)(*(long *)(paVar21->_M_local_buf + 8) + 0x389) == '\x01') {
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[32],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)paVar21->_M_local_buf,(char (*) [32])"#include \"wasm-rt-exceptions.h\"",
               pNVar24,in_RCX);
  }
  if (paVar21->_M_local_buf[0x348] == '\x01') {
    WriteV128Decl((CWriter *)paVar21);
  }
  if (*(int *)(paVar21->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar21,"\n",1);
    *(int *)(paVar21->_M_local_buf + 0x94) = *(int *)(paVar21->_M_local_buf + 0x94) + 1;
  }
  paVar21->_M_local_buf[0x90] = '\x01';
  pcVar29 = s_header_top;
  sVar16 = strlen(s_header_top);
  WriteData((CWriter *)paVar21,pcVar29,sVar16);
  if (*(int *)(paVar21->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar21,"\n",1);
    *(int *)(paVar21->_M_local_buf + 0x94) = *(int *)(paVar21->_M_local_buf + 0x94) + 1;
  }
  paVar21->_M_local_buf[0x90] = true;
  ppIVar37 = ((*(Module **)(paVar21->_M_local_buf + 8))->imports).
             super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppIVar4 = ((*(Module **)(paVar21->_M_local_buf + 8))->imports).
            super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar37 == ppIVar4) {
    paVar19 = paVar21;
    paVar27 = paVar21;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffed0,"w2c_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (paVar21->_M_local_buf + 0x200));
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[16],std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)paVar21->_M_local_buf,(char (*) [16])&stack0xfffffffffffffed0,u_04,
               (char (*) [2])paVar19,(OpenBrace *)in_R8._M_p);
    pNVar24 = extraout_RDX_10;
    paVar19 = paVar27;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffed0._M_p != &local_120) {
      operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
      pNVar24 = extraout_RDX_11;
      paVar19 = paVar27;
    }
  }
  else {
    local_98._8_8_ = local_a8 + 8;
    local_a8._8_4_ = _S_red;
    local_98._0_8_ = (_Link_type)0x0;
    local_80 = 0;
    this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)(paVar21->_M_local_buf + 0x268);
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (paVar21->_M_local_buf + 0x298);
    paVar19 = paVar21;
    local_88 = (_Rb_tree_node_base *)local_98._8_8_;
    do {
      local_e8._0_8_ = *ppIVar37;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffed0,&((Import *)local_e8._0_8_)->module_name,
                 &((Import *)local_e8._0_8_)->field_name);
      pVar42 = std::
               _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>>
               ::
               _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>,wabt::Import_const*&>
                         ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::pair<std::__cxx11::string,std::__cxx11::string>const,wabt::Import_const*>>>
                           *)local_a8,
                          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&stack0xfffffffffffffed0,(Import **)local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0._M_p != &local_120) {
        operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
      }
      if (((undefined1  [16])pVar42 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if (*(ExternalKind *)(*(long *)(pVar42.first._M_node._M_node + 3) + 0x48) !=
            *(ExternalKind *)(local_e8._0_8_ + 0x48)) {
          printf("unimplemented: %s\n","contradictory import declaration");
          abort();
        }
        _GLOBAL__N_1::CWriter::WriteCHeader((CWriter *)local_e8._0_8_);
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_e8._0_8_ + 8));
      if (*(ExternalKind *)(local_e8._0_8_ + 0x48) == First) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_e8._0_8_ + 8));
      }
      ppIVar37 = ppIVar37 + 1;
    } while (ppIVar37 != ppIVar4);
    if ((_Rb_tree_node_base *)local_98._8_8_ != (_Rb_tree_node_base *)(local_a8 + 8)) {
      this_02 = (vector<wabt::Import_const*,std::allocator<wabt::Import_const*>> *)
                (paVar19->_M_local_buf + 0x250);
      uVar17 = local_98._8_8_;
      do {
        paVar21 = paVar19;
        __position._M_current = *(Import ***)&((CWriter *)(paVar21->_M_local_buf + 600))->field_0x0;
        paVar19 = paVar21;
        if (__position._M_current ==
            *(Import ***)&((CWriter *)(paVar21->_M_local_buf + 0x260))->field_0x0) {
          std::vector<wabt::Import_const*,std::allocator<wabt::Import_const*>>::
          _M_realloc_insert<wabt::Import_const*const&>
                    (this_02,__position,(Import **)(uVar17 + 0x60));
        }
        else {
          *__position._M_current = *(Import **)(uVar17 + 0x60);
          *(long *)&((CWriter *)(paVar21->_M_local_buf + 600))->field_0x0 =
               *(long *)&((CWriter *)(paVar21->_M_local_buf + 600))->field_0x0 + 8;
        }
        uVar17 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar17);
      } while ((_Rb_tree_node_base *)uVar17 != (_Rb_tree_node_base *)(local_a8 + 8));
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>_>
    ::_M_erase((_Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_wabt::Import_*>_>_>
                *)local_a8,(_Link_type)local_98._0_8_);
    plVar26 = *(long **)(*(long *)(paVar19->_M_local_buf + 8) + 0xb8);
    local_60 = *(long **)(*(long *)(paVar19->_M_local_buf + 8) + 0xc0);
    if (plVar26 != local_60) {
      local_68 = (CWriter *)(paVar19->_M_local_buf + 0xf8);
      local_70 = (CWriter *)((long)paVar19 + 0x158);
      local_78 = (CWriter *)(paVar19->_M_local_buf + 0x98);
      do {
        lVar36 = *plVar26;
        local_f0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar36 + 8);
        pCVar5 = *(CWriter **)(lVar36 + 0x10);
        local_58 = *(size_t *)(lVar36 + 0x28);
        pcVar29 = *(char **)(lVar36 + 0x30);
        in_R8._M_p = (pointer)&local_120;
        local_128 = (SymbolSet *)0x0;
        local_120._M_allocated_capacity = local_120._M_allocated_capacity & 0xffffffffffffff00;
        uVar40 = 0x61;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)this;
        if (*(uint *)(lVar36 + 0x48) < 5) {
          uVar40 = 0x6b62686661 >> ((byte)(*(uint *)(lVar36 + 0x48) << 3) & 0x3f);
          std::__cxx11::string::_M_assign((string *)&stack0xfffffffffffffed0);
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)this;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffed0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar36 + 8)
                  );
        this = (CWriter *)local_a8;
        module_name._M_str = pcVar29;
        module_name._M_len = (size_t)local_f0;
        export_name_00._M_str = (char *)paVar21;
        export_name_00._M_len = local_58;
        (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                  ((string *)this,pCVar5,module_name,export_name_00);
        pCVar1 = local_70;
        pVar43 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_70,(key_type *)this);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pCVar1,(_Base_ptr)pVar43.first._M_node,(_Base_ptr)pVar43.second._M_node);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        wasm_name_00._M_str = (char *)this;
        wasm_name_00._M_len = (size_t)in_R8._M_p;
        in_stack_fffffffffffffed0._M_p = in_R8._M_p;
        ClaimName(pCVar1,(SymbolSet *)local_78,(SymbolMap *)(uVar40 & 0xff),'\0',wasm_name_00,
                  (string *)paVar19);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ != &local_98) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0._M_p != &local_120) {
          operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
        }
        plVar26 = plVar26 + 1;
      } while (plVar26 != local_60);
    }
    p_Var18 = *(_Rb_tree_node_base **)&((CWriter *)(paVar19->_M_local_buf + 0x280))->field_0x0;
    pCVar5 = (CWriter *)(paVar19->_M_local_buf + 0x270);
    if (p_Var18 != (_Rb_tree_node_base *)pCVar5) {
      pCVar1 = (CWriter *)(paVar19->_M_local_buf + 0x158);
      local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (paVar19->_M_local_buf + 0x98);
      do {
        in_R8._M_p = *(pointer *)(p_Var18 + 1);
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)p_Var18[1]._M_parent;
        module_name_00._M_str = (char *)0x8;
        module_name_00._M_len = (size_t)in_R8._M_p;
        export_name_01._M_str = (char *)this;
        export_name_01._M_len = (size_t)"instance";
        pcVar29 = "instance";
        (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)paVar21->_M_local_buf,
                   module_name_00,export_name_01);
        proposed_name._M_str = pcVar29;
        proposed_name._M_len = (size_t)in_stack_fffffffffffffed0._M_p;
        FindUniqueName((string *)local_a8,pCVar1,local_128,proposed_name);
        wasm_name_01._M_str = (char *)local_a8;
        wasm_name_01._M_len = (size_t)in_R8._M_p;
        this = (CWriter *)local_a8;
        ClaimName(pCVar1,(SymbolSet *)local_f0,(SymbolMap *)0x63,(char)paVar21,wasm_name_01,
                  (string *)paVar19);
        paVar27 = paVar19;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0._M_p != &local_120) {
          operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          paVar27 = paVar19;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._0_8_ != &local_98) {
          operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
        }
        module_name_01._M_str = (char *)paVar21;
        module_name_01._M_len = *(size_t *)(p_Var18 + 1);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)p_Var18[1]._M_parent,module_name_01
                  );
        paVar19 = paVar27;
        WriteData((CWriter *)paVar27,"struct ",7);
        WriteData((CWriter *)paVar27,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)paVar27->_M_local_buf,(char (*) [2])0x1f107a,u_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0._M_p != &local_120) {
          operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
        }
        p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
      } while (p_Var18 != (_Rb_tree_node_base *)pCVar5);
    }
    plVar26 = *(long **)&((CWriter *)(paVar19->_M_local_buf + 0x250))->field_0x0;
    plVar2 = *(long **)&((CWriter *)(paVar19->_M_local_buf + 600))->field_0x0;
    paVar27 = paVar19;
    if (plVar26 != plVar2) {
      do {
        lVar36 = *plVar26;
        if ((*(uint *)(lVar36 + 0x48) & 0xfffffffb) != 0) {
          WriteData((CWriter *)paVar19,"extern ",7);
          iVar25 = *(int *)(lVar36 + 0x48);
          paVar19 = paVar27;
          if (iVar25 == 1) {
            WriteTableType((CWriter *)paVar27,(Type *)(lVar36 + 0x88));
          }
          else if (iVar25 == 2) {
            pcVar29 = "wasm_rt_memory_t";
            if (*(char *)(lVar36 + 0x81) != '\0') {
              pcVar29 = "wasm_rt_shared_memory_t";
            }
            pcVar23 = pcVar29 + 0x10;
            if (*(char *)(lVar36 + 0x81) != '\0') {
              pcVar23 = pcVar29 + 0x17;
            }
            in_stack_fffffffffffffed0._M_p = (pointer)&local_120;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffed0,pcVar29,pcVar23);
            WriteData((CWriter *)paVar27,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
            paVar19 = paVar27;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffffed0._M_p != &local_120) {
              operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
              paVar19 = paVar27;
            }
          }
          else {
            if (iVar25 != 3) goto LAB_0019dc67;
            Write((CWriter *)paVar27,*(Type *)(lVar36 + 0x70));
          }
          in_R8._M_p = *(pointer *)(lVar36 + 0x28);
          paVar21 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(lVar36 + 0x30);
          module_name_02._M_str = (char *)paVar21;
          module_name_02._M_len = *(size_t *)(lVar36 + 8);
          export_name_02._M_str = (char *)this;
          export_name_02._M_len = (size_t)in_R8._M_p;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,*(CWriter **)(lVar36 + 0x10),module_name_02,
                     export_name_02);
          module_name_03._M_str = (char *)paVar21;
          module_name_03._M_len = *(size_t *)(lVar36 + 8);
          (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                    ((string *)local_e8,*(CWriter **)(lVar36 + 0x10),module_name_03);
          WriteData((CWriter *)paVar27,"* ",2);
          WriteData((CWriter *)paVar27,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
          WriteData((CWriter *)paVar27,"(struct ",8);
          WriteData((CWriter *)paVar27,(char *)local_e8._0_8_,local_e8._8_8_);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)paVar27->_M_local_buf,(char (*) [4])"*);",u_01);
          if ((Import *)local_e8._0_8_ != (Import *)(local_e8 + 0x10)) {
            operator_delete((void *)local_e8._0_8_,CONCAT62(local_e8._18_6_,local_e8._16_2_) + 1);
          }
          paVar27 = paVar19;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0._M_p != &local_120) {
            operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
            paVar27 = paVar19;
          }
        }
        plVar26 = plVar26 + 1;
      } while (plVar26 != plVar2);
    }
    if (*(int *)(paVar19->_M_local_buf + 0x94) < 2) {
      WriteData((CWriter *)paVar19,"\n",1);
      paVar19 = paVar27;
      *(int *)(paVar19->_M_local_buf + 0x94) = *(int *)(paVar19->_M_local_buf + 0x94) + 1;
      paVar27 = paVar19;
    }
    paVar19->_M_local_buf[0x90] = true;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffed0,"w2c_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (paVar19->_M_local_buf + 0x200));
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[16],std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
              ((CWriter *)paVar19->_M_local_buf,(char (*) [16])&stack0xfffffffffffffed0,u_02,
               (char (*) [2])paVar21,(OpenBrace *)in_R8._M_p);
    pNVar24 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffed0._M_p != &local_120) {
      operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
      pNVar24 = extraout_RDX_02;
    }
    p_Var18 = *(_Rb_tree_node_base **)&((CWriter *)(paVar27->_M_local_buf + 0x2b0))->field_0x0;
    pCVar5 = (CWriter *)(paVar27->_M_local_buf + 0x2a0);
    if (p_Var18 != (_Rb_tree_node_base *)pCVar5) {
      do {
        module_name_04._M_str = (char *)paVar21;
        module_name_04._M_len = *(size_t *)(p_Var18 + 1);
        (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)p_Var18[1]._M_parent,module_name_04
                  );
        local_e8._0_4_ = 2;
        paVar19 = paVar27;
        local_e8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(p_Var18 + 1);
        WriteData((CWriter *)paVar27,"struct ",7);
        WriteData((CWriter *)paVar27,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
        WriteData((CWriter *)paVar27,"* ",2);
        Write((CWriter *)paVar27,(GlobalName *)local_e8);
        (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)paVar27->_M_local_buf,(char (*) [2])0x1f107a,u_03);
        paVar27 = paVar19;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0._M_p != &local_120) {
          operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          paVar27 = paVar19;
        }
        auVar44 = std::_Rb_tree_increment(p_Var18);
        pNVar24 = auVar44._8_8_;
        p_Var18 = auVar44._0_8_;
      } while (p_Var18 != (_Rb_tree_node_base *)pCVar5);
    }
    plVar26 = *(long **)&((CWriter *)(paVar27->_M_local_buf + 0x250))->field_0x0;
    plVar2 = *(long **)&((CWriter *)(paVar27->_M_local_buf + 600))->field_0x0;
    paVar19 = paVar27;
    if (plVar26 != plVar2) {
      pIVar12 = (Import *)(local_e8 + 0x10);
      do {
        lVar36 = *plVar26;
        if ((*(uint *)(lVar36 + 0x48) & 0xfffffffb) != 0) {
          str._M_str = (char *)paVar21;
          str._M_len = *(size_t *)(lVar36 + 8);
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,*(_anonymous_namespace_ **)(lVar36 + 0x10),
                     str);
          str_00._M_str = (char *)paVar21;
          str_00._M_len = *(size_t *)(lVar36 + 0x28);
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)local_e8,*(_anonymous_namespace_ **)(lVar36 + 0x30),str_00);
          WriteData((CWriter *)paVar19,"/* import: \'",0xc);
          WriteData((CWriter *)paVar19,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
          WriteData((CWriter *)paVar19,"\' \'",3);
          WriteData((CWriter *)paVar19,(char *)local_e8._0_8_,local_e8._8_8_);
          WriteData((CWriter *)paVar19,"\' */",4);
          if (*(int *)(paVar19->_M_local_buf + 0x94) < 2) {
            WriteData((CWriter *)paVar19,"\n",1);
            *(int *)(paVar19->_M_local_buf + 0x94) = *(int *)(paVar19->_M_local_buf + 0x94) + 1;
          }
          paVar19->_M_local_buf[0x90] = '\x01';
          if ((Import *)local_e8._0_8_ != pIVar12) {
            operator_delete((void *)local_e8._0_8_,CONCAT62(local_e8._18_6_,local_e8._16_2_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0._M_p != &local_120) {
            operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          }
          iVar25 = *(int *)(lVar36 + 0x48);
          if (iVar25 == 1) {
            local_e8._16_2_ = 0x2a;
            local_e8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            module_name_07._M_str = *(char **)(lVar36 + 0x30);
            module_name_07._M_len = *(size_t *)(lVar36 + 8);
            export_name_05._M_str = (char *)paVar27;
            export_name_05._M_len = *(size_t *)(lVar36 + 0x28);
            local_e8._0_8_ = pIVar12;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      (&local_c8,*(CWriter **)(lVar36 + 0x10),module_name_07,export_name_05);
            pcVar30 = (pointer)0xf;
            if ((Import *)local_e8._0_8_ != pIVar12) {
              pcVar30 = (pointer)CONCAT62(local_e8._18_6_,local_e8._16_2_);
            }
            in_R8._M_p = (pointer)local_e8._8_8_;
            if (pcVar30 < (pointer)(local_e8._8_8_ + local_c8._M_string_length)) {
              uVar17 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                uVar17 = local_c8.field_2._0_8_;
              }
              if ((ulong)uVar17 < (pointer)(local_e8._8_8_ + local_c8._M_string_length))
              goto LAB_0019cdb2;
              puVar20 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_e8._0_8_)
              ;
            }
            else {
LAB_0019cdb2:
              puVar20 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)local_e8,(ulong)local_c8._M_dataplus._M_p);
            }
            in_stack_fffffffffffffed0._M_p = (pointer)&local_120;
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar20 == paVar21) {
              local_120._M_allocated_capacity = paVar21->_M_allocated_capacity;
              local_120._8_8_ = puVar20[3];
            }
            else {
              local_120._M_allocated_capacity = paVar21->_M_allocated_capacity;
              in_stack_fffffffffffffed0._M_p = (pointer)*puVar20;
            }
            local_128 = (SymbolSet *)puVar20[1];
            *puVar20 = paVar21;
            puVar20[1] = 0;
            paVar21->_M_local_buf[0] = '\0';
            WriteTable((CWriter *)paVar19,(string *)&stack0xfffffffffffffed0,(Type *)(lVar36 + 0x88)
                      );
            pNVar24 = extraout_RDX_04;
          }
          else if (iVar25 == 2) {
            local_e8._16_2_ = 0x2a;
            local_e8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            module_name_06._M_str = *(char **)(lVar36 + 0x30);
            module_name_06._M_len = *(size_t *)(lVar36 + 8);
            export_name_04._M_str = (char *)paVar27;
            export_name_04._M_len = *(size_t *)(lVar36 + 0x28);
            local_e8._0_8_ = pIVar12;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      (&local_c8,*(CWriter **)(lVar36 + 0x10),module_name_06,export_name_04);
            pcVar30 = (pointer)0xf;
            if ((Import *)local_e8._0_8_ != pIVar12) {
              pcVar30 = (pointer)CONCAT62(local_e8._18_6_,local_e8._16_2_);
            }
            in_R8._M_p = (pointer)local_e8._8_8_;
            if (pcVar30 < (pointer)(local_e8._8_8_ + local_c8._M_string_length)) {
              uVar17 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                uVar17 = local_c8.field_2._0_8_;
              }
              if ((ulong)uVar17 < (pointer)(local_e8._8_8_ + local_c8._M_string_length))
              goto LAB_0019cd25;
              puVar20 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_e8._0_8_)
              ;
            }
            else {
LAB_0019cd25:
              puVar20 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)local_e8,(ulong)local_c8._M_dataplus._M_p);
            }
            in_stack_fffffffffffffed0._M_p = (pointer)&local_120;
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar20 == paVar21) {
              local_120._M_allocated_capacity = paVar21->_M_allocated_capacity;
              local_120._8_8_ = puVar20[3];
            }
            else {
              local_120._M_allocated_capacity = paVar21->_M_allocated_capacity;
              in_stack_fffffffffffffed0._M_p = (pointer)*puVar20;
            }
            local_128 = (SymbolSet *)puVar20[1];
            *puVar20 = paVar21;
            puVar20[1] = 0;
            paVar21->_M_local_buf[0] = '\0';
            if (*(int *)(lVar36 + 0x48) != 2) {
              pcVar29 = 
              "const Derived *wabt::cast(const Base *) [Derived = wabt::MemoryImport, Base = wabt::Import]"
              ;
              goto LAB_0019dc81;
            }
            WriteMemory((CWriter *)paVar19,(string *)&stack0xfffffffffffffed0,
                        (Memory *)(lVar36 + 0x50));
            pNVar24 = extraout_RDX_03;
          }
          else {
            if (iVar25 != 3) {
LAB_0019dc67:
              abort();
            }
            local_e8._16_2_ = 0x2a;
            local_e8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
            module_name_05._M_str = *(char **)(lVar36 + 0x30);
            module_name_05._M_len = *(size_t *)(lVar36 + 8);
            export_name_03._M_str = (char *)paVar27;
            export_name_03._M_len = *(size_t *)(lVar36 + 0x28);
            local_e8._0_8_ = pIVar12;
            (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                      (&local_c8,*(CWriter **)(lVar36 + 0x10),module_name_05,export_name_03);
            pcVar30 = (pointer)0xf;
            if ((Import *)local_e8._0_8_ != pIVar12) {
              pcVar30 = (pointer)CONCAT62(local_e8._18_6_,local_e8._16_2_);
            }
            in_R8._M_p = (pointer)local_e8._8_8_;
            if (pcVar30 < (pointer)(local_e8._8_8_ + local_c8._M_string_length)) {
              uVar17 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                uVar17 = local_c8.field_2._0_8_;
              }
              if ((ulong)uVar17 < (pointer)(local_e8._8_8_ + local_c8._M_string_length))
              goto LAB_0019cc98;
              puVar20 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,local_e8._0_8_)
              ;
            }
            else {
LAB_0019cc98:
              puVar20 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)local_e8,(ulong)local_c8._M_dataplus._M_p);
            }
            in_stack_fffffffffffffed0._M_p = (pointer)&local_120;
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar20 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar20 == paVar21) {
              local_120._M_allocated_capacity = paVar21->_M_allocated_capacity;
              local_120._8_8_ = puVar20[3];
            }
            else {
              local_120._M_allocated_capacity = paVar21->_M_allocated_capacity;
              in_stack_fffffffffffffed0._M_p = (pointer)*puVar20;
            }
            local_128 = (SymbolSet *)puVar20[1];
            *puVar20 = paVar21;
            puVar20[1] = 0;
            paVar21->_M_local_buf[0] = '\0';
            WriteGlobal((CWriter *)paVar19,(Global *)(lVar36 + 0x50),
                        (string *)&stack0xfffffffffffffed0);
            pNVar24 = extraout_RDX_05;
          }
          paVar27 = paVar19;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0._M_p != &local_120) {
            operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
            pNVar24 = extraout_RDX_06;
            paVar27 = paVar19;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._0_8_ + 1));
            pNVar24 = extraout_RDX_07;
          }
          if ((Import *)local_e8._0_8_ != pIVar12) {
            operator_delete((void *)local_e8._0_8_,CONCAT62(local_e8._18_6_,local_e8._16_2_) + 1);
            pNVar24 = extraout_RDX_08;
          }
          if (*(int *)(paVar27->_M_local_buf + 0x94) < 2) {
            WriteData((CWriter *)paVar27,"\n",1);
            *(int *)(paVar27->_M_local_buf + 0x94) = *(int *)(paVar27->_M_local_buf + 0x94) + 1;
            pNVar24 = extraout_RDX_09;
          }
          *(CWriter *)(paVar27->_M_local_buf + 0x90) = (CWriter)0x1;
          paVar19 = paVar27;
        }
        plVar26 = plVar26 + 1;
      } while (plVar26 != plVar2);
    }
  }
  lVar36 = *(long *)(paVar27->_M_local_buf + 8);
  puVar20 = *(undefined8 **)(lVar36 + 0xa8);
  puVar38 = *(undefined8 **)(lVar36 + 0xa0);
  lVar32 = (long)puVar20 - (long)puVar38;
  if ((lVar32 != 0) && (lVar32 >> 3 != (ulong)*(uint *)(lVar36 + 0x68))) {
    uVar15 = 0;
    do {
      if (*(uint *)(*(long *)(paVar27->_M_local_buf + 8) + 0x68) <= uVar15) {
        global = (Global *)*puVar38;
        in_R8._M_p = (global->name)._M_dataplus._M_p;
        name_00._M_str = in_R8._M_p;
        name_00._M_len = (global->name)._M_string_length;
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)paVar27->_M_local_buf,Global,
                   name_00);
        WriteGlobal((CWriter *)paVar27,global,(string *)&stack0xfffffffffffffed0);
        pNVar24 = extraout_RDX_12;
        paVar27 = paVar19;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0._M_p != &local_120) {
          operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          pNVar24 = extraout_RDX_13;
          paVar27 = paVar19;
        }
        if (*(int *)(paVar27->_M_local_buf + 0x94) < 2) {
          WriteData((CWriter *)paVar27,"\n",1);
          *(int *)(paVar27->_M_local_buf + 0x94) = *(int *)(paVar27->_M_local_buf + 0x94) + 1;
          pNVar24 = extraout_RDX_14;
        }
        *(CWriter *)(paVar27->_M_local_buf + 0x90) = (CWriter)0x1;
        paVar19 = paVar27;
      }
      uVar15 = uVar15 + 1;
      puVar38 = puVar38 + 1;
    } while (puVar38 != puVar20);
  }
  lVar36 = *(long *)(paVar27->_M_local_buf + 8);
  puVar20 = *(undefined8 **)(lVar36 + 0x138);
  puVar38 = *(undefined8 **)(lVar36 + 0x130);
  lVar32 = (long)puVar20 - (long)puVar38;
  if ((lVar32 != 0) && (lVar32 >> 3 != (ulong)*(uint *)(lVar36 + 100))) {
    uVar15 = 0;
    do {
      if (*(uint *)(*(long *)(paVar27->_M_local_buf + 8) + 100) <= uVar15) {
        memory = (Memory *)*puVar38;
        in_R8._M_p = (memory->name)._M_dataplus._M_p;
        name_01._M_str = in_R8._M_p;
        name_01._M_len = (memory->name)._M_string_length;
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)paVar27->_M_local_buf,Memory,
                   name_01);
        WriteMemory((CWriter *)paVar27,(string *)&stack0xfffffffffffffed0,memory);
        pNVar24 = extraout_RDX_15;
        paVar27 = paVar19;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0._M_p != &local_120) {
          operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          pNVar24 = extraout_RDX_16;
          paVar27 = paVar19;
        }
        if (*(int *)(paVar27->_M_local_buf + 0x94) < 2) {
          WriteData((CWriter *)paVar27,"\n",1);
          *(int *)(paVar27->_M_local_buf + 0x94) = *(int *)(paVar27->_M_local_buf + 0x94) + 1;
          pNVar24 = extraout_RDX_17;
        }
        *(CWriter *)(paVar27->_M_local_buf + 0x90) = (CWriter)0x1;
        paVar19 = paVar27;
      }
      uVar15 = uVar15 + 1;
      puVar38 = puVar38 + 1;
    } while (puVar38 != puVar20);
  }
  lVar36 = *(long *)(paVar27->_M_local_buf + 8);
  puVar20 = *(undefined8 **)(lVar36 + 0x108);
  puVar38 = *(undefined8 **)(lVar36 + 0x100);
  lVar32 = (long)puVar20 - (long)puVar38;
  if ((lVar32 != 0) && (lVar32 >> 3 != (ulong)*(uint *)(lVar36 + 0x60))) {
    uVar15 = 0;
    do {
      if (*(uint *)(*(long *)(paVar27->_M_local_buf + 8) + 0x60) <= uVar15) {
        puVar6 = (undefined8 *)*puVar38;
        in_R8._M_p = (pointer)*puVar6;
        name_02._M_str = in_R8._M_p;
        name_02._M_len = puVar6[1];
        (anonymous_namespace)::CWriter::DefineInstanceMemberName_abi_cxx11_
                  ((string *)&stack0xfffffffffffffed0,(CWriter *)paVar27->_M_local_buf,Table,name_02
                  );
        WriteTable((CWriter *)paVar27,(string *)&stack0xfffffffffffffed0,(Type *)(puVar6 + 7));
        pNVar24 = extraout_RDX_18;
        paVar27 = paVar19;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)in_stack_fffffffffffffed0._M_p != &local_120) {
          operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          pNVar24 = extraout_RDX_19;
          paVar27 = paVar19;
        }
        if (*(int *)(paVar27->_M_local_buf + 0x94) < 2) {
          WriteData((CWriter *)paVar27,"\n",1);
          *(int *)(paVar27->_M_local_buf + 0x94) = *(int *)(paVar27->_M_local_buf + 0x94) + 1;
          pNVar24 = extraout_RDX_20;
        }
        *(CWriter *)(paVar27->_M_local_buf + 0x90) = (CWriter)0x1;
        paVar19 = paVar27;
      }
      uVar15 = uVar15 + 1;
      puVar38 = puVar38 + 1;
    } while (puVar38 != puVar20);
  }
  puVar20 = *(undefined8 **)(*(long *)(paVar27->_M_local_buf + 8) + 0x148);
  puVar38 = *(undefined8 **)(*(long *)(paVar27->_M_local_buf + 8) + 0x150);
  if (puVar20 != puVar38) {
    do {
      piVar7 = (int *)*puVar20;
      in_R8._M_p = *(pointer *)(piVar7 + 2);
      pbVar22 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(piVar7 + 4);
      name_03._M_str = in_R8._M_p;
      name_03._M_len = (size_t)pbVar22;
      (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)paVar27->_M_local_buf,DataSegment,
                 name_03);
      pNVar24 = extraout_RDX_21;
      if ((*piVar7 == 1) && (*(long *)(piVar7 + 0x22) != *(long *)(piVar7 + 0x24))) {
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[6],char_const(&)[22],std::__cxx11::string&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)paVar19->_M_local_buf,(char (*) [6])0x1f145d,
                   (char (*) [22])&stack0xfffffffffffffed0,pbVar22,(char (*) [6])in_R8._M_p,
                   (Newline *)paVar27->_M_local_buf);
        pNVar24 = extraout_RDX_22;
      }
      paVar27 = paVar19;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0._M_p != &local_120) {
        operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
        pNVar24 = extraout_RDX_23;
      }
      puVar20 = puVar20 + 1;
      paVar19 = paVar27;
    } while (puVar20 != puVar38);
  }
  puVar20 = *(undefined8 **)(*(long *)(paVar27->_M_local_buf + 8) + 0x118);
  puVar38 = *(undefined8 **)(*(long *)(paVar27->_M_local_buf + 8) + 0x120);
  if (puVar20 != puVar38) {
    do {
      piVar7 = (int *)*puVar20;
      in_R8._M_p = *(pointer *)(piVar7 + 2);
      pbVar22 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(piVar7 + 4);
      name_04._M_str = in_R8._M_p;
      name_04._M_len = (size_t)pbVar22;
      (anonymous_namespace)::CWriter::DefineGlobalScopeName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)paVar27->_M_local_buf,ElemSegment,
                 name_04);
      pNVar24 = extraout_RDX_24;
      if ((*piVar7 == 1) && (*(long *)(piVar7 + 0x24) != *(long *)(piVar7 + 0x26))) {
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[6],char_const(&)[22],std::__cxx11::string&,char_const(&)[6],wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)paVar19->_M_local_buf,(char (*) [6])0x1f16b8,
                   (char (*) [22])&stack0xfffffffffffffed0,pbVar22,(char (*) [6])in_R8._M_p,
                   (Newline *)paVar27->_M_local_buf);
        pNVar24 = extraout_RDX_25;
      }
      paVar27 = paVar19;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0._M_p != &local_120) {
        operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
        pNVar24 = extraout_RDX_26;
      }
      puVar20 = puVar20 + 1;
      paVar19 = paVar27;
    } while (puVar20 != puVar38);
  }
  pMVar8 = *(Module **)(paVar27->_M_local_buf + 8);
  pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (pMVar8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((((pbVar22 ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (pMVar8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) &&
       (pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (pMVar8->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
       pbVar22 ==
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
       _M_impl.super__Vector_impl_data._M_finish)) &&
      (pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
      pbVar22 ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      (pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) && (*(size_t *)(paVar27->_M_local_buf + 0x2c0) == 0)) {
    (anonymous_namespace)::CWriter::Write<char_const(&)[19],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)paVar27->_M_local_buf,(char (*) [19])"char dummy_member;",pNVar24);
    paVar27 = paVar19;
    paVar19 = paVar27;
  }
  pbVar33 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            (paVar27->_M_local_buf + 0x200);
  paVar21 = paVar27;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed0,"w2c_",pbVar33);
  Write((CWriter *)paVar27);
  WriteData((CWriter *)paVar27," ",1);
  (anonymous_namespace)::CWriter::
  Write<std::__cxx11::string,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)paVar27->_M_local_buf,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffed0,(char (*) [2])0x1f107a,(Newline *)pbVar22);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffed0._M_p != &local_120) {
    operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
  }
  if (*(int *)(paVar19->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar19,"\n",1);
    *(int *)(paVar19->_M_local_buf + 0x94) = *(int *)(paVar19->_M_local_buf + 0x94) + 1;
  }
  paVar19->_M_local_buf[0x90] = '\x01';
  paVar27 = paVar19;
  local_f0 = pbVar33;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed0,"w2c_",pbVar33);
  WriteData((CWriter *)paVar19,"void ",5);
  WriteData((CWriter *)paVar19,"wasm2c_",7);
  WriteData((CWriter *)paVar19,*(char **)(paVar19->_M_local_buf + 0x200),
            *(size_t *)(paVar19->_M_local_buf + 0x208));
  WriteData((CWriter *)paVar19,"_instantiate(",0xd);
  WriteData((CWriter *)paVar19,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
  WriteData((CWriter *)paVar19,"*",1);
  pNVar24 = extraout_RDX_27;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffed0._M_p != &local_120) {
    operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
    pNVar24 = extraout_RDX_28;
  }
  p_Var18 = *(_Rb_tree_node_base **)(paVar27->_M_local_buf + 0x280);
  paVar19 = paVar27;
  if (p_Var18 != (_Rb_tree_node_base *)(paVar27->_M_local_buf + 0x270)) {
    do {
      module_name_08._M_str = (char *)pbVar22;
      module_name_08._M_len = *(size_t *)(p_Var18 + 1);
      (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                ((string *)&stack0xfffffffffffffed0,(CWriter *)p_Var18[1]._M_parent,module_name_08);
      WriteData((CWriter *)paVar27,", struct ",9);
      WriteData((CWriter *)paVar27,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
      WriteData((CWriter *)paVar27,"*",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)in_stack_fffffffffffffed0._M_p != &local_120) {
        operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
      }
      auVar44 = std::_Rb_tree_increment(p_Var18);
      pNVar24 = auVar44._8_8_;
      p_Var18 = auVar44._0_8_;
    } while (p_Var18 != (_Rb_tree_node_base *)(paVar27->_M_local_buf + 0x270));
  }
  paVar27 = paVar19;
  (anonymous_namespace)::CWriter::Write<char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)paVar19->_M_local_buf,(char (*) [3])0x1f1dea,pNVar24);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffed0,"w2c_",local_f0);
  WriteData((CWriter *)paVar19,"void ",5);
  WriteData((CWriter *)paVar19,"wasm2c_",7);
  WriteData((CWriter *)paVar19,*(char **)(paVar19->_M_local_buf + 0x200),
            *(size_t *)(paVar19->_M_local_buf + 0x208));
  WriteData((CWriter *)paVar19,"_free(",6);
  WriteData((CWriter *)paVar19,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
  WriteData((CWriter *)paVar19,"*);",3);
  if (*(int *)(paVar19->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar19,"\n",1);
    paVar19 = paVar27;
    *(int *)(paVar19->_M_local_buf + 0x94) = *(int *)(paVar19->_M_local_buf + 0x94) + 1;
    paVar27 = paVar19;
  }
  paVar19->_M_local_buf[0x90] = '\x01';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffed0._M_p != &local_120) {
    paVar19 = paVar27;
    operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
    paVar27 = paVar19;
  }
  WriteData((CWriter *)paVar19,"wasm_rt_func_type_t ",0x14);
  WriteData((CWriter *)paVar27,"wasm2c_",7);
  WriteData((CWriter *)paVar27,*(char **)(paVar27->_M_local_buf + 0x200),
            *(size_t *)(paVar27->_M_local_buf + 0x208));
  WriteData((CWriter *)paVar27,"_get_func_type(uint32_t param_count, uint32_t result_count, ...);",
            0x41);
  if (*(int *)(paVar27->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar27,"\n",1);
    *(int *)(paVar27->_M_local_buf + 0x94) = *(int *)(paVar27->_M_local_buf + 0x94) + 1;
  }
  paVar27->_M_local_buf[0x90] = true;
  ppTVar9 = ((*(Module **)(paVar27->_M_local_buf + 8))->types).
            super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  paVar19 = paVar27;
  for (ppTVar41 = ((*(Module **)(paVar27->_M_local_buf + 8))->types).
                  super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppTVar41 != ppTVar9; ppTVar41 = ppTVar41 + 1) {
    pTVar10 = *ppTVar41;
    if (pTVar10->kind_ != Func) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x4e,
                    "Derived *wabt::cast(Base *) [Derived = wabt::FuncType, Base = wabt::TypeEntry]"
                   );
    }
    if ((*(long *)((long)&pTVar10[1].loc.field_1 + 8) - *(long *)&pTVar10[1].loc.field_1 &
        0x7fffffff0U) != 0) {
      DeclareStruct((CWriter *)paVar27,(TypeVector *)&pTVar10[1].loc.field_1.field_0);
      paVar27 = paVar19;
      paVar19 = paVar27;
    }
  }
  if ((((vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *)
       (paVar27->_M_local_buf + 0x250))->
      super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>)._M_impl.
      super__Vector_impl_data._M_start != *(pointer *)(paVar27->_M_local_buf + 600)) {
    if (*(int *)(paVar27->_M_local_buf + 0x94) < 2) {
      WriteData((CWriter *)paVar27,"\n",1);
      paVar27 = paVar19;
      *(int *)(paVar27->_M_local_buf + 0x94) = *(int *)(paVar27->_M_local_buf + 0x94) + 1;
      paVar19 = paVar27;
    }
    paVar27->_M_local_buf[0x90] = true;
    ppIVar28 = (((vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_> *)
                (paVar27->_M_local_buf + 0x250))->
               super__Vector_base<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppIVar11 = *(pointer *)(paVar27->_M_local_buf + 600);
    if (ppIVar28 != ppIVar11) {
      do {
        pIVar12 = *ppIVar28;
        if (pIVar12->kind_ == Last) {
          str_03._M_str = (char *)pbVar22;
          str_03._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (_anonymous_namespace_ *)(pIVar12->module_name)._M_string_length,str_03);
          str_04._M_str = (char *)pbVar22;
          str_04._M_len = (size_t)(pIVar12->field_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)local_a8,
                     (_anonymous_namespace_ *)(pIVar12->field_name)._M_string_length,str_04);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::Newline,char_const(&)[13],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)paVar27->_M_local_buf,(Newline *)&stack0xfffffffffffffed0,
                     (char (*) [13])local_a8,pbVar22,(char (*) [4])in_R8._M_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar21,
                     (char (*) [5])paVar19,(Newline *)in_stack_fffffffffffffed0._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._0_8_ != &local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0._M_p != &local_120) {
            operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          }
          in_R8._M_p = (pIVar12->field_name)._M_dataplus._M_p;
          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pIVar12->field_name)._M_string_length;
          module_name_11._M_str = (char *)pbVar22;
          module_name_11._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
          export_name_07._M_str = (char *)paVar21;
          export_name_07._M_len = (size_t)in_R8._M_p;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (CWriter *)(pIVar12->module_name)._M_string_length,module_name_11,
                     export_name_07);
          paVar27 = paVar19;
          WriteData((CWriter *)paVar19,"extern const wasm_rt_tag_t ",0x1b);
          WriteData((CWriter *)paVar19,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)paVar19->_M_local_buf,(char (*) [2])0x1f107a,u_05);
          paVar19 = paVar27;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0._M_p != &local_120) {
            operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
            paVar19 = paVar27;
          }
        }
        else if (pIVar12->kind_ == First) {
          str_01._M_str = (char *)pbVar22;
          str_01._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (_anonymous_namespace_ *)(pIVar12->module_name)._M_string_length,str_01);
          str_02._M_str = (char *)pbVar22;
          str_02._M_len = (size_t)(pIVar12->field_name)._M_dataplus._M_p;
          (anonymous_namespace)::SanitizeForComment_abi_cxx11_
                    ((string *)local_a8,
                     (_anonymous_namespace_ *)(pIVar12->field_name)._M_string_length,str_02);
          (anonymous_namespace)::CWriter::
          Write<wabt::(anonymous_namespace)::Newline,char_const(&)[13],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)paVar27->_M_local_buf,(Newline *)&stack0xfffffffffffffed0,
                     (char (*) [13])local_a8,pbVar22,(char (*) [4])in_R8._M_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar21,
                     (char (*) [5])paVar19,(Newline *)in_stack_fffffffffffffed0._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._0_8_ != &local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0._M_p != &local_120) {
            operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          }
          if (pIVar12->kind_ != First) {
            pcVar29 = 
            "const Derived *wabt::cast(const Base *) [Derived = wabt::FuncImport, Base = wabt::Import]"
            ;
LAB_0019dc81:
            __assert_fail("isa<Derived>(base)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                          ,0x48,pcVar29);
          }
          in_R8._M_p = (pIVar12->field_name)._M_dataplus._M_p;
          pbVar22 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (pIVar12->field_name)._M_string_length;
          module_name_09._M_str = (char *)pbVar22;
          module_name_09._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
          export_name_06._M_str = (char *)paVar21;
          export_name_06._M_len = (size_t)in_R8._M_p;
          (anonymous_namespace)::CWriter::ExportName_abi_cxx11_
                    ((string *)local_a8,(CWriter *)(pIVar12->module_name)._M_string_length,
                     module_name_09,export_name_06);
          this_03 = paVar19;
          (anonymous_namespace)::CWriter::
          Write<std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
                    ((CWriter *)paVar19->_M_local_buf,
                     (vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                     &pIVar12[2].field_name.field_2,(char (*) [2])local_a8,pbVar22,
                     (char (*) [2])in_R8._M_p);
          module_name_10._M_str = (char *)pbVar22;
          module_name_10._M_len = (size_t)(pIVar12->module_name)._M_dataplus._M_p;
          (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
                    ((string *)&stack0xfffffffffffffed0,
                     (CWriter *)(pIVar12->module_name)._M_string_length,module_name_10);
          WriteData((CWriter *)paVar19,"struct ",7);
          WriteData((CWriter *)paVar19,in_stack_fffffffffffffed0._M_p,(size_t)local_128);
          WriteData((CWriter *)paVar19,"*",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffed0._M_p != &local_120) {
            operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
          }
          paVar27 = this_03;
          WriteParamTypes((CWriter *)this_03,
                          (FuncDeclaration *)((long)&pIVar12[1].module_name.field_2 + 8));
          WriteData((CWriter *)this_03,")",1);
          pNVar24 = extraout_RDX_29;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._0_8_ != &local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
            pNVar24 = extraout_RDX_30;
          }
          paVar19 = paVar27;
          (anonymous_namespace)::CWriter::
          Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                    ((CWriter *)paVar27->_M_local_buf,(char (*) [2])0x1f107a,pNVar24);
          if (*(char *)(paVar27->_M_allocated_capacity + 0x18) == '\x01') {
            GetTailCallRef((string *)&stack0xfffffffffffffed0,(CWriter *)paVar27,
                           (string *)(pIVar12 + 1));
            WriteTailCallFuncDeclaration((CWriter *)paVar27,(string *)&stack0xfffffffffffffed0);
            pNVar24 = extraout_RDX_31;
            paVar27 = paVar19;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)in_stack_fffffffffffffed0._M_p != &local_120) {
              operator_delete(in_stack_fffffffffffffed0._M_p,local_120._M_allocated_capacity + 1);
              pNVar24 = extraout_RDX_32;
              paVar27 = paVar19;
            }
            paVar19 = paVar27;
            (anonymous_namespace)::CWriter::
            Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                      ((CWriter *)paVar27->_M_local_buf,(char (*) [2])0x1f107a,pNVar24);
          }
        }
        ppIVar28 = ppIVar28 + 1;
      } while (ppIVar28 != ppIVar11);
    }
  }
  WriteImportProperties((CWriter *)paVar27,Declarations);
  WriteExports((CWriter *)paVar19,Declarations);
  if (*(char *)(paVar19->_M_allocated_capacity + 0x18) == '\x01') {
    WriteTailCallExports((CWriter *)paVar19,Declarations);
  }
  if (*(int *)(paVar19->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar19,"\n",1);
    *(int *)(paVar19->_M_local_buf + 0x94) = *(int *)(paVar19->_M_local_buf + 0x94) + 1;
  }
  paVar19->_M_local_buf[0x90] = '\x01';
  pcVar29 = s_header_bottom;
  sVar16 = strlen(s_header_bottom);
  WriteData((CWriter *)paVar19,pcVar29,sVar16);
  if (*(int *)(paVar19->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar19,"\n",1);
    *(int *)(paVar19->_M_local_buf + 0x94) = *(int *)(paVar19->_M_local_buf + 0x94) + 1;
  }
  paVar19->_M_local_buf[0x90] = '\x01';
  WriteData((CWriter *)paVar19,"#endif  /* ",0xb);
  WriteData((CWriter *)paVar19,(char *)local_50._M_allocated_capacity,local_50._8_8_);
  WriteData((CWriter *)paVar19," */",3);
  if (*(int *)(paVar19->_M_local_buf + 0x94) < 2) {
    WriteData((CWriter *)paVar19,"\n",1);
    *(int *)(paVar19->_M_local_buf + 0x94) = *(int *)(paVar19->_M_local_buf + 0x94) + 1;
  }
  paVar19->_M_local_buf[0x90] = '\x01';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void CWriter::WriteCHeader() {
  ReserveExportNames();

  stream_ = h_stream_;
  std::string guard = GenerateHeaderGuard();
  Write("/* Automatically generated by wasm2c */", Newline());
  Write("#ifndef ", guard, Newline());
  Write("#define ", guard, Newline());
  Write(Newline());
  ComputeSimdScope();
  WriteHeaderIncludes();
  Write(s_header_top);
  Write(Newline());
  WriteModuleInstance();
  WriteInitDecl();
  WriteFreeDecl();
  WriteGetFuncTypeDecl();
  WriteMultivalueResultTypes();
  WriteImports();
  WriteImportProperties(CWriterPhase::Declarations);
  WriteExports(CWriterPhase::Declarations);
  if (options_.features.tail_call_enabled()) {
    WriteTailCallExports(CWriterPhase::Declarations);
  }
  Write(Newline());
  Write(s_header_bottom);
  Write(Newline(), "#endif  /* ", guard, " */", Newline());
}